

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

potVec * __thiscall
OpenMD::Stats::getPotVecAverage(potVec *__return_storage_ptr__,Stats *this,int index)

{
  long lVar1;
  
  Vector<double,_7U>::Vector(__return_storage_ptr__);
  lVar1 = __dynamic_cast((this->data_).
                         super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                         &BaseAccumulator::typeinfo,&PotVecAccumulator::typeinfo,0);
  Vector<double,_7U>::operator=(__return_storage_ptr__,(Vector<double,_7U> *)(lVar1 + 0x48));
  return __return_storage_ptr__;
}

Assistant:

potVec Stats::getPotVecAverage(int index) {
    assert(index >= 0 && index < ENDINDEX);
    potVec value;
    dynamic_cast<PotVecAccumulator*>(data_[index].accumulator)
        ->getAverage(value);
    return value;
  }